

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.c
# Opt level: O2

bndCond createBoundCond(int wl,int wr,int wt,int wb)

{
  return (bndCond)ZEXT416((wl & 3U) * 0x40 + (wr & 3U) * 4 | wt & 3U | (wb & 3U) << 4);
}

Assistant:

bndCond createBoundCond (int wl, int wr, int wt, int wb)
{
	bndCond bCond;
	bCond.wl = wl;
	bCond.wr = wr;
	bCond.wt = wt;
	bCond.wb = wb;
	bCond.FLAG = NULL;
	return bCond;
}